

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall TcpSocketImpl::Close(TcpSocketImpl *this)

{
  mutex *__mutex;
  int iVar1;
  int *piVar2;
  pointer *__ptr;
  timespec local_38;
  thread local_28;
  
  this->m_bCloseReq = true;
  __mutex = &(this->super_BaseSocketImpl).m_mxWrite;
  do {
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)__mutex);
    std::condition_variable::notify_all();
    if (iVar1 == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  } while ((((this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>._M_i &
            2) == 0) && ((this->super_BaseSocketImpl).m_iError == 0));
  (this->super_BaseSocketImpl).m_bStop = true;
  if ((this->m_pRefServSocket == (TcpServer *)0x0) &&
     ((((this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>._M_i ==
        '\x0f' &&
       ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
        (_Manager_type)0x0 ||
        (this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
        (_Manager_type)0x0)) && ((this->super_BaseSocketImpl).m_thClose._M_id._M_thread == 0)))) {
    local_28._M_id._M_thread = (id)0;
    local_38.tv_sec = (__time_t)operator_new(0x10);
    *(undefined ***)local_38.tv_sec = &PTR___State_00146758;
    *(TcpSocketImpl **)(local_38.tv_sec + 8) = this;
    std::thread::_M_start_thread(&local_28,&local_38,0);
    if ((long *)local_38.tv_sec != (long *)0x0) {
      (**(code **)(*(long *)local_38.tv_sec + 8))();
    }
    if ((this->super_BaseSocketImpl).m_thClose._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->super_BaseSocketImpl).m_thClose._M_id._M_thread =
         (native_handle_type)local_28._M_id._M_thread;
    if ((this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
        (_Manager_type)0x0 ||
        (this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      do {
        local_38.tv_sec = 0;
        local_38.tv_nsec = 1000000;
        do {
          iVar1 = nanosleep(&local_38,&local_38);
          if (iVar1 != -1) break;
          piVar2 = __errno_location();
        } while (*piVar2 == 4);
      } while ((this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
               (_Manager_type)0x0 ||
               (this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
               (_Manager_type)0x0);
    }
  }
  return;
}

Assistant:

void TcpSocketImpl::Close()
{
    //OutputDebugString(L"TcpSocketImpl::Close\r\n");
    m_bCloseReq = true; // Stops the write thread after the last byte was send
    do
    {
        const bool bIsLocked = m_mxWrite.try_lock();
        m_cv.notify_all();
        if (bIsLocked == true)
            m_mxWrite.unlock();
    } while ((m_iShutDownState & 2) == 0 && m_iError == 0); // Wait until the write thread is finished
    m_bStop = true; // Stops the listening thread

    if (m_pRefServSocket == nullptr && m_iShutDownState == 15 && (m_fClosing || m_fClosingParam) && m_thClose.joinable() == false)
    {
        m_thClose = thread([&]() {
            StartClosingCB();
        });

        while (m_fClosingParam != nullptr || m_fClosing != nullptr)
            this_thread::sleep_for(chrono::milliseconds(1));
    }
}